

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O1

void nni_stat_add(nni_stat_item *parent,nni_stat_item *child)

{
  if ((parent->si_children).ll_head.ln_next == (nni_list_node *)0x0) {
    nni_list_init_offset(&parent->si_children,0);
  }
  if ((child->si_children).ll_head.ln_next == (nni_list_node *)0x0) {
    nni_list_init_offset(&child->si_children,0);
  }
  nni_list_append(&parent->si_children,child);
  return;
}

Assistant:

void
nni_stat_add(nni_stat_item *parent, nni_stat_item *child)
{
#ifdef NNG_ENABLE_STATS
	// Make sure that the lists for both children and parents
	// are correctly initialized.
	if (parent->si_children.ll_head.ln_next == NULL) {
		NNI_LIST_INIT(&parent->si_children, nni_stat_item, si_node);
	}
	if (child->si_children.ll_head.ln_next == NULL) {
		NNI_LIST_INIT(&child->si_children, nni_stat_item, si_node);
	}
	nni_list_append(&parent->si_children, child);
#else
	NNI_ARG_UNUSED(parent);
	NNI_ARG_UNUSED(child);
#endif
}